

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map2json.c
# Opt level: O3

void map2json_createJsonString(csafestring_t *buffer,map2json_tree_t *tree)

{
  jsmntype_t jVar1;
  long lVar2;
  long lVar3;
  s_map2json_tree *tree_00;
  
  if (tree != (map2json_tree_t *)0x0) {
    do {
      if (tree->key != (char *)0x0) {
        safe_strchrappend(buffer,'\"');
        safe_strcat(buffer,tree->key);
        safe_strchrappend(buffer,'\"');
        safe_strchrappend(buffer,':');
      }
      jVar1 = tree->type;
      if (jVar1 == JSMN_OBJECT) {
        safe_strchrappend(buffer,'{');
        map2json_createJsonString(buffer,tree->children);
        safe_strchrappend(buffer,'}');
        jVar1 = tree->type;
      }
      if (jVar1 == JSMN_ARRAY) {
        safe_strchrappend(buffer,'[');
        lVar2 = tree->maxArrayId;
        if (0 < lVar2) {
          lVar3 = 0;
          do {
            tree_00 = tree->arrayObjects;
            if (tree_00 != (s_map2json_tree *)0x0) {
              do {
                if (tree_00->arrayId == lVar3) {
                  map2json_createJsonString(buffer,tree_00);
                }
                tree_00 = tree_00->arrayObjects;
              } while (tree_00 != (s_map2json_tree *)0x0);
              lVar2 = tree->maxArrayId;
            }
            if (lVar3 < lVar2 + -1) {
              safe_strchrappend(buffer,',');
              lVar2 = tree->maxArrayId;
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 < lVar2);
        }
        safe_strchrappend(buffer,']');
        jVar1 = tree->type;
      }
      if (jVar1 - JSMN_STRING < 2) {
        if (jVar1 == JSMN_STRING) {
          safe_strchrappend(buffer,'\"');
        }
        safe_strcat(buffer,tree->value);
        if (tree->type == JSMN_STRING) {
          safe_strchrappend(buffer,'\"');
        }
      }
      if (tree->next == (s_map2json_tree *)0x0) {
        return;
      }
      safe_strchrappend(buffer,',');
      tree = tree->next;
    } while (tree != (s_map2json_tree *)0x0);
  }
  return;
}

Assistant:

static void map2json_createJsonString(csafestring_t *buffer, map2json_tree_t *tree) {
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... ", buffer->data);

	if ( tree == NULL ) {
		DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
		return;
	}

	if ( tree->key != NULL ) {
		safe_strchrappend(buffer, '\"');
		safe_strcat(buffer, tree->key);
		safe_strchrappend(buffer, '\"');
		safe_strchrappend(buffer, ':');
	}

	if ( tree->type == JSMN_OBJECT ) {
		safe_strchrappend(buffer, '{');
		map2json_createJsonString(buffer, tree->children);
		safe_strchrappend(buffer, '}');
	}

	if ( tree->type == JSMN_ARRAY ) {
		map2json_createJsonStringArray(buffer, tree);
	}

	if ( tree->type == JSMN_PRIMITIVE || tree->type == JSMN_STRING ) {
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
		safe_strcat(buffer, tree->value);
		if ( tree->type == JSMN_STRING ) {
			safe_strchrappend(buffer, '\"');
		}
	}

	if ( tree->next != NULL ) {
		safe_strchrappend(buffer, ',');
		map2json_createJsonString(buffer, tree->next);
	}
	DEBUG_TEXT("map2json_createJsonString(%s, [map2json_tree_t *])... DONE", buffer->data);
}